

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O0

TRANSPORT_LL_HANDLE
IoTHubTransportHttp_Create
          (IOTHUBTRANSPORT_CONFIG *config,TRANSPORT_CALLBACKS_INFO *cb_info,void *ctx)

{
  _Bool _Var1;
  int iVar2;
  HTTPAPIEX_RESULT HVar3;
  LOGGER_LOG p_Var4;
  _Bool local_6d;
  _Bool local_6c;
  _Bool was_perDeviceList_ok;
  _Bool was_httpApiExHandle_ok;
  _Bool was_hostName_ok;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  HTTPTRANSPORT_HANDLE_DATA *result;
  void *ctx_local;
  TRANSPORT_CALLBACKS_INFO *cb_info_local;
  IOTHUBTRANSPORT_CONFIG *config_local;
  
  if (config == (IOTHUBTRANSPORT_CONFIG *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"IoTHubTransportHttp_Create",0x3be,1,"invalid arg (configuration is missing)");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (config->upperConfig == (IOTHUB_CLIENT_CONFIG *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"IoTHubTransportHttp_Create",0x3c3,1,"invalid arg (upperConfig is NULL)");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (config->upperConfig->protocol == (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"IoTHubTransportHttp_Create",0x3c8,1,"invalid arg (protocol is NULL)");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (config->upperConfig->iotHubName == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"IoTHubTransportHttp_Create",0x3cd,1,"invalid arg (iotHubName is NULL)");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (config->upperConfig->iotHubSuffix == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"IoTHubTransportHttp_Create",0x3d2,1,"invalid arg (iotHubSuffix is NULL)");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    iVar2 = IoTHub_Transport_ValidateCallbacks(cb_info);
    if (iVar2 == 0) {
      l = (LOGGER_LOG)malloc(0x70);
      if ((HTTPTRANSPORT_HANDLE_DATA *)l == (HTTPTRANSPORT_HANDLE_DATA *)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                    ,"IoTHubTransportHttp_Create",0x3df,1,"unable to malloc");
        }
      }
      else {
        HVar3 = HTTPAPIEX_Init();
        if (HVar3 == HTTPAPIEX_ERROR) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                      ,"IoTHubTransportHttp_Create",0x3e3,1,"Error initializing HTTP");
          }
          free(l);
          l = (LOGGER_LOG)0x0;
        }
        else {
          _Var1 = create_hostName((HTTPTRANSPORT_HANDLE_DATA *)l,config);
          local_6c = false;
          if (_Var1) {
            local_6c = create_httpApiExHandle((HTTPTRANSPORT_HANDLE_DATA *)l,config);
          }
          local_6d = false;
          if (local_6c != false) {
            local_6d = create_perDeviceList((HTTPTRANSPORT_HANDLE_DATA *)l);
          }
          if (local_6d == false) {
            if (local_6c != false) {
              destroy_httpApiExHandle((HTTPTRANSPORT_HANDLE_DATA *)l);
            }
            if (_Var1) {
              destroy_hostName((HTTPTRANSPORT_HANDLE_DATA *)l);
            }
            HTTPAPIEX_Deinit();
            free(l);
            l = (LOGGER_LOG)0x0;
          }
          else {
            ((HTTPTRANSPORT_HANDLE_DATA *)l)->doBatchedTransfers = false;
            ((HTTPTRANSPORT_HANDLE_DATA *)l)->getMinimumPollingTime = 0x5dc;
            ((HTTPTRANSPORT_HANDLE_DATA *)l)->transport_ctx = ctx;
            memcpy(&((HTTPTRANSPORT_HANDLE_DATA *)l)->transport_callbacks,cb_info,0x48);
          }
        }
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                  ,"IoTHubTransportHttp_Create",0x3d7,1,"Invalid transport callback information");
      }
      l = (LOGGER_LOG)0x0;
    }
  }
  return l;
}

Assistant:

static TRANSPORT_LL_HANDLE IoTHubTransportHttp_Create(const IOTHUBTRANSPORT_CONFIG* config, TRANSPORT_CALLBACKS_INFO* cb_info, void* ctx)
{
    HTTPTRANSPORT_HANDLE_DATA* result;
    if (config == NULL)
    {
        LogError("invalid arg (configuration is missing)");
        result = NULL;
    }
    else if (config->upperConfig == NULL)
    {
        LogError("invalid arg (upperConfig is NULL)");
        result = NULL;
    }
    else if (config->upperConfig->protocol == NULL)
    {
        LogError("invalid arg (protocol is NULL)");
        result = NULL;
    }
    else if (config->upperConfig->iotHubName == NULL)
    {
        LogError("invalid arg (iotHubName is NULL)");
        result = NULL;
    }
    else if (config->upperConfig->iotHubSuffix == NULL)
    {
        LogError("invalid arg (iotHubSuffix is NULL)");
        result = NULL;
    }
    else if (IoTHub_Transport_ValidateCallbacks(cb_info) != 0)
    {
        LogError("Invalid transport callback information");
        result = NULL;
    }
    else
    {
        result = (HTTPTRANSPORT_HANDLE_DATA*)malloc(sizeof(HTTPTRANSPORT_HANDLE_DATA));
        if (result == NULL)
        {
            LogError("unable to malloc");
        }
        else if (HTTPAPIEX_Init() == HTTPAPIEX_ERROR)
        {
            LogError("Error initializing HTTP");
            free(result);
            result = NULL;
        }
        else
        {
            bool was_hostName_ok = create_hostName(result, config);
            bool was_httpApiExHandle_ok = was_hostName_ok && create_httpApiExHandle(result, config);
            bool was_perDeviceList_ok = was_httpApiExHandle_ok && create_perDeviceList(result);

            if (was_perDeviceList_ok)
            {
                result->doBatchedTransfers = false;
                result->getMinimumPollingTime = DEFAULT_GETMINIMUMPOLLINGTIME;

                result->transport_ctx = ctx;
                memcpy(&result->transport_callbacks, cb_info, sizeof(TRANSPORT_CALLBACKS_INFO));
            }
            else
            {
                if (was_httpApiExHandle_ok) destroy_httpApiExHandle(result);
                if (was_hostName_ok) destroy_hostName(result);
                HTTPAPIEX_Deinit();

                free(result);
                result = NULL;
            }
        }
    }
    return result;
}